

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void mon_summary(wchar_t gid,int *item_list,wchar_t n,wchar_t top,wchar_t row,wchar_t col)

{
  _Bool _Var1;
  char *pcVar2;
  uint local_38;
  wchar_t tkills;
  wchar_t oid;
  wchar_t kills;
  wchar_t i;
  wchar_t col_local;
  wchar_t row_local;
  wchar_t top_local;
  wchar_t n_local;
  int *item_list_local;
  wchar_t gid_local;
  
  tkills = L'\0';
  for (oid = L'\0'; oid < n; oid = oid + L'\x01') {
    tkills = (uint)l_list[default_join[item_list[oid + top]].oid].pkills + tkills;
  }
  if ((gid == L'\0') &&
     (_Var1 = flag_has_dbg(r_info[default_join[*item_list].oid].flags,0xc,1,
                           "(&r_info[default_join[item_list[0]].oid])->flags","RF_UNIQUE"), _Var1))
  {
    pcVar2 = format("%d known uniques, %d slain.",(ulong)(uint)n,(ulong)(uint)tkills);
    c_prt('\x0e',pcVar2,row,col);
  }
  else {
    local_38 = 0;
    for (oid = L'\0'; oid < (int)(uint)z_info->r_max; oid = oid + L'\x01') {
      local_38 = l_list[oid].pkills + local_38;
    }
    pcVar2 = format("Creatures slain: %d/%d (in group/in total)",(ulong)(uint)tkills,(ulong)local_38
                   );
    c_prt('\x0e',pcVar2,row,col);
  }
  return;
}

Assistant:

static void mon_summary(int gid, const int *item_list, int n, int top,
						int row, int col)
{
	int i;
	int kills = 0;

	/* Access the race */
	for (i = 0; i < n; i++) {
		int oid = default_join[item_list[i+top]].oid;
		kills += l_list[oid].pkills;
	}

	/* Different display for the first item if we've got uniques to show */
	if (gid == 0 &&
		rf_has((&r_info[default_join[item_list[0]].oid])->flags, RF_UNIQUE)) {
		c_prt(COLOUR_L_BLUE, format("%d known uniques, %d slain.", n, kills),
					row, col);
	} else {
		int tkills = 0;

		for (i = 0; i < z_info->r_max; i++)
			tkills += l_list[i].pkills;

		c_prt(COLOUR_L_BLUE, format("Creatures slain: %d/%d (in group/in total)", kills, tkills), row, col);
	}
}